

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O3

int send_doc(curl_socket_t sock,httprequest *req)

{
  long testno;
  bool bVar1;
  uint uVar2;
  __pid_t _Var3;
  ssize_t sVar4;
  char *pcVar5;
  FILE *pFVar6;
  char *pcVar7;
  size_t __n;
  int *piVar8;
  uint *puVar9;
  char *pcVar10;
  int iVar11;
  uint uVar12;
  httprequest *phVar13;
  size_t sVar14;
  char *pcVar15;
  bool bVar16;
  char *cmd;
  size_t count;
  int num;
  size_t cmdsize;
  char partbuf [80];
  char *local_c8;
  char *local_c0;
  size_t local_b8;
  uint local_ac;
  httprequest *local_a8;
  size_t local_a0;
  FILE *local_98;
  size_t local_90;
  int local_88;
  char local_84;
  
  local_c8 = (char *)0x0;
  local_c0 = (char *)0x0;
  local_90 = 0;
  pcVar15 = "log/server.response";
  if (is_proxy != '\0') {
    pcVar15 = "log/proxy.response";
  }
  if (req->rcmd == 1) {
    return 0;
  }
  if (req->rcmd == 2) {
    do {
      sVar4 = send(sock,"a string to stream 01234567890\n",0x1f,0x4000);
      if (got_exit_signal != 0) {
        return -1;
      }
    } while (sVar4 == 0x1f);
    logmsg("Stopped streaming");
    return -1;
  }
  req->open = false;
  testno = req->testno;
  if (testno < 0) {
    if (testno == -2) {
      logmsg("Identifying ourselves as friends");
      _Var3 = getpid();
      curl_msnprintf((char *)&local_88,0x40,"WE ROOLZ: %ld\r\n",(long)_Var3);
      if (use_gopher == 1) {
        pcVar10 = send_doc::weare;
        curl_msnprintf(send_doc::weare,0x100,"%s",&local_88);
      }
      else {
        pcVar10 = send_doc::weare;
        sVar14 = strlen((char *)&local_88);
        curl_msnprintf(send_doc::weare,0x100,"HTTP/1.1 200 OK\r\nContent-Length: %zu\r\n\r\n%s",
                       sVar14,&local_88);
      }
    }
    else if (testno == -3) {
      logmsg("Replying to QUIT");
      pcVar10 = "HTTP/1.1 200 Goodbye\r\n\r\n";
    }
    else {
      logmsg("Replying to with a 404");
      pcVar10 = 
      "HTTP/1.1 404 Not Found\r\nServer: curl test suite HTTP server/0.1\r\nConnection: close\r\nContent-Type: text/html\r\n\r\n<!DOCTYPE HTML PUBLIC \"-//IETF//DTD HTML 2.0//EN\">\n<HTML><HEAD>\n<TITLE>404 Not Found</TITLE>\n</HEAD><BODY>\n<H1>Not Found</H1>\nThe requested URL was not found on this server.\n<P><HR><ADDRESS>curl test suite HTTP server/0.1</ADDRESS>\n</BODY></HTML>\n"
      ;
    }
    local_b8 = strlen(pcVar10);
  }
  else {
    pcVar5 = test2file(testno);
    pcVar10 = "data";
    if (req->connect_request != false) {
      pcVar10 = "connect";
    }
    if (req->partno == 0) {
      curl_msnprintf((char *)&local_88,0x50,"%s",pcVar10);
    }
    else {
      curl_msnprintf((char *)&local_88,0x50,"%s%ld",pcVar10);
    }
    logmsg("Send response test%ld section <%s>",req->testno,&local_88);
    pFVar6 = fopen64(pcVar5,"rb");
    if (pFVar6 == (FILE *)0x0) {
      puVar9 = (uint *)__errno_location();
      uVar2 = *puVar9;
      pcVar15 = strerror(uVar2);
      logmsg("fopen() failed with error: %d %s",(ulong)uVar2,pcVar15);
      logmsg("  [3] Error opening file: %s",pcVar5);
      return 0;
    }
    uVar2 = getpart(&local_c8,&local_b8,"reply",(char *)&local_88,(FILE *)pFVar6);
    fclose(pFVar6);
    pcVar10 = local_c8;
    if (uVar2 != 0) {
      logmsg("getpart() failed with error: %d",(ulong)uVar2);
      return 0;
    }
    if (got_exit_signal != 0) goto LAB_00107035;
    local_a8 = req;
    pFVar6 = fopen64(pcVar5,"rb");
    if (pFVar6 == (FILE *)0x0) {
      puVar9 = (uint *)__errno_location();
      uVar2 = *puVar9;
      pcVar15 = strerror(uVar2);
      logmsg("fopen() failed with error: %d %s",(ulong)uVar2,pcVar15);
      logmsg("  [4] Error opening file: %s",pcVar5);
LAB_00107326:
      free(local_c8);
      return 0;
    }
    uVar2 = getpart(&local_c0,&local_90,"reply","postcmd",(FILE *)pFVar6);
    fclose(pFVar6);
    req = local_a8;
    if (uVar2 != 0) {
      logmsg("getpart() failed with error: %d",(ulong)uVar2);
      goto LAB_00107326;
    }
  }
  if (got_exit_signal == 0) {
    pcVar5 = strstr(pcVar10,"swsclose");
    bVar16 = local_b8 != 0;
    if (!bVar16 || pcVar5 != (char *)0x0) {
      logmsg("connection close instruction \"swsclose\" found in response");
    }
    pcVar7 = strstr(pcVar10,"swsbounce");
    if (pcVar7 == (char *)0x0) {
      prevbounce = 0;
    }
    else {
      prevbounce = 1;
      logmsg("enable \"swsbounce\" in the next request");
    }
    local_98 = fopen64(pcVar15,"ab");
    if (local_98 == (FILE *)0x0) {
      puVar9 = (uint *)__errno_location();
      uVar2 = *puVar9;
      pcVar10 = strerror(uVar2);
      logmsg("fopen() failed with error: %d %s",(ulong)uVar2,pcVar10);
      logmsg("  [5] Error opening file: %s",pcVar15);
    }
    else {
      local_a0 = local_b8;
      local_a8 = req;
      do {
        sVar14 = local_b8;
        if (199 < local_b8) {
          sVar14 = 200;
        }
        __n = send(sock,pcVar10,sVar14,0x4000);
        if ((long)__n < 0) {
          piVar8 = __errno_location();
          do {
            if (*piVar8 != 0xb) {
              bVar1 = true;
              pFVar6 = local_98;
              phVar13 = local_a8;
              goto LAB_0010724f;
            }
            wait_ms(10);
            __n = send(sock,pcVar10,sVar14,0x4000);
          } while ((long)__n < 0);
        }
        logmsg("Sent off %zd bytes",__n);
        fwrite(pcVar10,1,__n,local_98);
        local_b8 = local_b8 - __n;
        uVar2 = local_a8->writedelay;
        if ((uVar2 != 0) && (logmsg("Pausing %d seconds",(ulong)uVar2), 0 < (int)uVar2)) {
          iVar11 = uVar2 * 4 + 1;
          do {
            if (got_exit_signal != 0) break;
            wait_ms(0xfa);
            iVar11 = iVar11 + -1;
          } while (1 < iVar11);
        }
      } while ((local_b8 != 0) && (pcVar10 = pcVar10 + __n, got_exit_signal == 0));
      bVar1 = false;
      pFVar6 = local_98;
      phVar13 = local_a8;
LAB_0010724f:
      do {
        iVar11 = fclose(pFVar6);
        if (iVar11 == 0) goto LAB_00107284;
        puVar9 = (uint *)__errno_location();
        uVar2 = *puVar9;
      } while (uVar2 == 4);
      pcVar10 = strerror(uVar2);
      logmsg("Error closing file %s error: %d %s",pcVar15,(ulong)uVar2,pcVar10);
LAB_00107284:
      if (got_exit_signal == 0) {
        if (!bVar1) {
          logmsg("Response sent (%zu bytes) and written to %s",local_a0,pcVar15);
          free(local_c8);
          pcVar15 = local_c8;
          if (local_90 != 0) {
            local_c8 = local_c0;
            do {
              iVar11 = __isoc99_sscanf(local_c8,"%31s %d",&local_88,&local_ac);
              if (iVar11 == 2) {
                if (local_84 == '\0' && local_88 == 0x74696177) {
                  logmsg("Told to sleep for %d seconds",(ulong)local_ac);
                  uVar12 = local_ac << 2;
                  uVar2 = (int)uVar12 >> 0x1f & uVar12;
                  do {
                    if ((int)uVar12 < 1) goto LAB_0010741e;
                    if (got_exit_signal != 0) goto LAB_00107434;
                    uVar12 = uVar12 - 1;
                    iVar11 = wait_ms(0xfa);
                  } while (iVar11 == 0);
                  puVar9 = (uint *)__errno_location();
                  uVar2 = *puVar9;
                  pcVar15 = strerror(uVar2);
                  logmsg("wait_ms() failed with error: (%d) %s",(ulong)uVar2,pcVar15);
                  uVar2 = uVar12;
LAB_0010741e:
                  if (uVar2 == 0) {
                    logmsg("Continuing after sleeping %d seconds",(ulong)local_ac);
                  }
                }
                else {
                  logmsg("Unknown command in reply command section");
                }
              }
LAB_00107434:
              pcVar15 = strchr(local_c8,10);
              local_c8 = pcVar15 + 1;
              phVar13 = local_a8;
            } while ((pcVar15 != (char *)0x0) && (pcVar15 = local_c8, *local_c8 != '\0'));
          }
          local_c8 = pcVar15;
          free(local_c0);
          phVar13->open = (_Bool)((bVar16 && pcVar5 == (char *)0x0) & (use_gopher ^ 1));
          prevtestno = phVar13->testno;
          prevpartno = phVar13->partno;
          return 0;
        }
        logmsg("Sending response failed. Only (%zu bytes) of (%zu bytes) were sent",
               local_a0 - local_b8);
      }
    }
  }
  free(local_c8);
  pcVar10 = local_c0;
LAB_00107035:
  free(pcVar10);
  return -1;
}

Assistant:

static int send_doc(curl_socket_t sock, struct httprequest *req)
{
  ssize_t written;
  size_t count;
  const char *buffer;
  char *ptr=NULL;
  FILE *stream;
  char *cmd=NULL;
  size_t cmdsize=0;
  FILE *dump;
  bool persistant = TRUE;
  bool sendfailure = FALSE;
  size_t responsesize;
  int error = 0;
  int res;
  const char *responsedump = is_proxy?RESPONSE_PROXY_DUMP:RESPONSE_DUMP;
  static char weare[256];

  switch(req->rcmd) {
  default:
  case RCMD_NORMALREQ:
    break; /* continue with business as usual */
  case RCMD_STREAM:
#define STREAMTHIS "a string to stream 01234567890\n"
    count = strlen(STREAMTHIS);
    for(;;) {
      written = swrite(sock, STREAMTHIS, count);
      if(got_exit_signal)
        return -1;
      if(written != (ssize_t)count) {
        logmsg("Stopped streaming");
        break;
      }
    }
    return -1;
  case RCMD_IDLE:
    /* Do nothing. Sit idle. Pretend it rains. */
    return 0;
  }

  req->open = FALSE;

  if(req->testno < 0) {
    size_t msglen;
    char msgbuf[64];

    switch(req->testno) {
    case DOCNUMBER_QUIT:
      logmsg("Replying to QUIT");
      buffer = docquit;
      break;
    case DOCNUMBER_WERULEZ:
      /* we got a "friends?" question, reply back that we sure are */
      logmsg("Identifying ourselves as friends");
      snprintf(msgbuf, sizeof(msgbuf), "WE ROOLZ: %ld\r\n", (long)getpid());
      msglen = strlen(msgbuf);
      if(use_gopher)
        snprintf(weare, sizeof(weare), "%s", msgbuf);
      else
        snprintf(weare, sizeof(weare),
                 "HTTP/1.1 200 OK\r\nContent-Length: %zu\r\n\r\n%s",
                 msglen, msgbuf);
      buffer = weare;
      break;
    case DOCNUMBER_404:
    default:
      logmsg("Replying to with a 404");
      buffer = doc404;
      break;
    }

    count = strlen(buffer);
  }
  else {
    char partbuf[80];
    char *filename = test2file(req->testno);

    /* select the <data> tag for "normal" requests and the <connect> one
       for CONNECT requests (within the <reply> section) */
    const char *section= req->connect_request?"connect":"data";

    if(req->partno)
      snprintf(partbuf, sizeof(partbuf), "%s%ld", section, req->partno);
    else
      snprintf(partbuf, sizeof(partbuf), "%s", section);

    logmsg("Send response test%ld section <%s>", req->testno, partbuf);

    stream=fopen(filename, "rb");
    if(!stream) {
      error = errno;
      logmsg("fopen() failed with error: %d %s", error, strerror(error));
      logmsg("  [3] Error opening file: %s", filename);
      return 0;
    }
    else {
      error = getpart(&ptr, &count, "reply", partbuf, stream);
      fclose(stream);
      if(error) {
        logmsg("getpart() failed with error: %d", error);
        return 0;
      }
      buffer = ptr;
    }

    if(got_exit_signal) {
      free(ptr);
      return -1;
    }

    /* re-open the same file again */
    stream=fopen(filename, "rb");
    if(!stream) {
      error = errno;
      logmsg("fopen() failed with error: %d %s", error, strerror(error));
      logmsg("  [4] Error opening file: %s", filename);
      free(ptr);
      return 0;
    }
    else {
      /* get the custom server control "commands" */
      error = getpart(&cmd, &cmdsize, "reply", "postcmd", stream);
      fclose(stream);
      if(error) {
        logmsg("getpart() failed with error: %d", error);
        free(ptr);
        return 0;
      }
    }
  }

  if(got_exit_signal) {
    free(ptr);
    free(cmd);
    return -1;
  }

  /* If the word 'swsclose' is present anywhere in the reply chunk, the
     connection will be closed after the data has been sent to the requesting
     client... */
  if(strstr(buffer, "swsclose") || !count) {
    persistant = FALSE;
    logmsg("connection close instruction \"swsclose\" found in response");
  }
  if(strstr(buffer, "swsbounce")) {
    prevbounce = TRUE;
    logmsg("enable \"swsbounce\" in the next request");
  }
  else
    prevbounce = FALSE;

  dump = fopen(responsedump, "ab");
  if(!dump) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("  [5] Error opening file: %s", responsedump);
    free(ptr);
    free(cmd);
    return -1;
  }

  responsesize = count;
  do {
    /* Ok, we send no more than 200 bytes at a time, just to make sure that
       larger chunks are split up so that the client will need to do multiple
       recv() calls to get it and thus we exercise that code better */
    size_t num = count;
    if(num > 200)
      num = 200;

    retry:
    written = swrite(sock, buffer, num);
    if(written < 0) {
      if((EWOULDBLOCK == SOCKERRNO) || (EAGAIN == SOCKERRNO)) {
        wait_ms(10);
        goto retry;
      }
      sendfailure = TRUE;
      break;
    }
    else {
      logmsg("Sent off %zd bytes", written);
    }

    /* write to file as well */
    fwrite(buffer, 1, (size_t)written, dump);

    count -= written;
    buffer += written;

    if(req->writedelay) {
      int quarters = req->writedelay * 4;
      logmsg("Pausing %d seconds", req->writedelay);
      while((quarters > 0) && !got_exit_signal) {
        quarters--;
        wait_ms(250);
      }
    }
  } while((count > 0) && !got_exit_signal);

  do {
    res = fclose(dump);
  } while(res && ((error = errno) == EINTR));
  if(res)
    logmsg("Error closing file %s error: %d %s",
           responsedump, error, strerror(error));

  if(got_exit_signal) {
    free(ptr);
    free(cmd);
    return -1;
  }

  if(sendfailure) {
    logmsg("Sending response failed. Only (%zu bytes) of (%zu bytes) "
           "were sent",
           responsesize-count, responsesize);
    free(ptr);
    free(cmd);
    return -1;
  }

  logmsg("Response sent (%zu bytes) and written to %s",
         responsesize, responsedump);
  free(ptr);

  if(cmdsize > 0) {
    char command[32];
    int quarters;
    int num;
    ptr=cmd;
    do {
      if(2 == sscanf(ptr, "%31s %d", command, &num)) {
        if(!strcmp("wait", command)) {
          logmsg("Told to sleep for %d seconds", num);
          quarters = num * 4;
          while((quarters > 0) && !got_exit_signal) {
            quarters--;
            res = wait_ms(250);
            if(res) {
              /* should not happen */
              error = errno;
              logmsg("wait_ms() failed with error: (%d) %s",
                     error, strerror(error));
              break;
            }
          }
          if(!quarters)
            logmsg("Continuing after sleeping %d seconds", num);
        }
        else
          logmsg("Unknown command in reply command section");
      }
      ptr = strchr(ptr, '\n');
      if(ptr)
        ptr++;
      else
        ptr = NULL;
    } while(ptr && *ptr);
  }
  free(cmd);
  req->open = use_gopher?FALSE:persistant;

  prevtestno = req->testno;
  prevpartno = req->partno;

  return 0;
}